

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_ECHHasDuplicateConfigID_Test::TestBody
          (SSLTest_ECHHasDuplicateConfigID_Test *this)

{
  uint8_t config_id;
  uint8_t *puVar1;
  int iVar2;
  EVP_HPKE_KEM *kem;
  uint8_t *puVar3;
  long lVar4;
  pointer *__ptr;
  char *message;
  char *in_R9;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  AssertionResult gtest_ar__1;
  uint8_t *ech_config;
  AssertHelper local_170;
  UniquePtr<uint8_t> free_ech_config;
  size_t ech_config_len;
  UniquePtr<SSL_ECH_KEYS> keys;
  AssertionResult gtest_ar_;
  AssertHelper local_130;
  ScopedEVP_HPKE_KEY key;
  undefined1 auStack_b8 [24];
  byte abStack_a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  undefined1 local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  undefined1 local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined1 local_40;
  
  auStack_b8[0x10] = 0;
  stack0xffffffffffffff59 = 0;
  auStack_b8._0_8_ = 0;
  auStack_b8[8] = 0;
  auStack_b8._9_7_ = 0;
  gtest_ar__1.success_ = true;
  __l._M_len = 1;
  __l._M_array = &gtest_ar__1.success_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_98,__l,(allocator_type *)&keys);
  local_80 = 0;
  key.ctx_.kem._0_4_ = 0xff030201;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&key;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_78,__l_00,(allocator_type *)&ech_config);
  local_60 = 0;
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0x10302;
  __l_01._M_len = 4;
  __l_01._M_array = &gtest_ar_.success_;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_58,__l_01,(allocator_type *)&ech_config_len);
  local_40 = 1;
  lVar4 = 0;
  do {
    if (lVar4 == 0x80) {
LAB_0015a90b:
      lVar4 = 0x60;
      do {
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   (auStack_b8 + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
      return;
    }
    keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<ssl_ech_keys_st,_bssl::internal::Deleter,_true,_true>)SSL_ECH_KEYS_new();
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
         keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl !=
         (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0;
    if ((tuple<ssl_ech_keys_st_*,_bssl::internal::Deleter>)
        keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl ==
        (_Head_base<0UL,_ssl_ech_keys_st_*,_false>)0x0) {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&key,(internal *)&gtest_ar_,(AssertionResult *)0x2f7801,"false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&ech_config,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x7b7,(char *)CONCAT44(key.ctx_.kem._4_4_,key.ctx_.kem._0_4_));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&ech_config,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ech_config);
      std::__cxx11::string::~string((string *)&key);
      if ((long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar__1._4_4_,gtest_ar__1._0_4_) + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
LAB_0015a901:
      std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&keys);
      goto LAB_0015a90b;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    puVar1 = *(uint8_t **)(auStack_b8 + lVar4 + 8);
    for (puVar3 = *(uint8_t **)(auStack_b8 + lVar4); puVar3 != puVar1; puVar3 = puVar3 + 1) {
      config_id = *puVar3;
      EVP_HPKE_KEY_zero(&key.ctx_);
      kem = EVP_hpke_x25519_hkdf_sha256();
      iVar2 = EVP_HPKE_KEY_generate(&key.ctx_,kem);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&ech_config);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)
                   "EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&ech_config_len,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7bb,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&ech_config_len,(Message *)&ech_config);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&ech_config_len);
        std::__cxx11::string::~string((string *)&gtest_ar_);
LAB_0015a84c:
        if ((tuple<unsigned_char_*,_bssl::internal::Deleter>)ech_config !=
            (_Head_base<0UL,_unsigned_char_*,_false>)0x0) {
          (**(code **)(*(long *)ech_config + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
LAB_0015a8f7:
        internal::
        StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
        ::~StackAllocatedMovable(&key);
        goto LAB_0015a901;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      in_R9 = (char *)0x10;
      iVar2 = SSL_marshal_ech_config
                        (&ech_config,&ech_config_len,config_id,&key.ctx_,"public.example",0x10);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&free_ech_config);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)
                   "SSL_marshal_ech_config(&ech_config, &ech_config_len, id, key.get(), \"public.example\", 16)"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_170,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7bf,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
        testing::internal::AssertHelper::operator=(&local_170,(Message *)&free_ech_config);
        testing::internal::AssertHelper::~AssertHelper(&local_170);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        ech_config = (uint8_t *)free_ech_config;
        goto LAB_0015a84c;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      free_ech_config._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)ech_config;
      iVar2 = SSL_ECH_KEYS_add((SSL_ECH_KEYS *)
                               keys._M_t.
                               super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
                               super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                               super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl,1,
                               ech_config,ech_config_len,&key.ctx_);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&local_170);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                   (AssertionResult *)
                   "SSL_ECH_KEYS_add(keys.get(), 1, ech_config, ech_config_len, key.get())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x7c2,(char *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_));
        testing::internal::AssertHelper::operator=(&local_130,(Message *)&local_170);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        std::__cxx11::string::~string((string *)&gtest_ar_);
        if (local_170.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_170.data_ + 8))();
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__1.message_);
        std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_ech_config);
        goto LAB_0015a8f7;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_ech_config);
      internal::
      StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
      ::~StackAllocatedMovable
                ((StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
                  *)&key.ctx_);
    }
    gtest_ar_._0_4_ = ZEXT14(abStack_a0[lVar4]);
    gtest_ar__1._0_4_ =
         SSL_ECH_KEYS_has_duplicate_config_id
                   ((SSL_ECH_KEYS *)
                    keys._M_t.super___uniq_ptr_impl<ssl_ech_keys_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_ech_keys_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_ech_keys_st_*,_false>._M_head_impl);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&key.ctx_,"test.has_duplicate ? 1 : 0",
               "SSL_ECH_KEYS_has_duplicate_config_id(keys.get())",(int *)&gtest_ar_,
               (int *)&gtest_ar__1);
    if ((char)key.ctx_.kem == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      message = "";
      if (key.ctx_.private_key._0_8_ != 0) {
        message = *(char **)key.ctx_.private_key._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x7c6,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&gtest_ar_)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
      if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)key.ctx_.private_key);
    std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&keys);
    lVar4 = lVar4 + 0x20;
  } while( true );
}

Assistant:

TEST(SSLTest, ECHHasDuplicateConfigID) {
  const struct {
    std::vector<uint8_t> ids;
    bool has_duplicate;
  } kTests[] = {
      {{}, false},
      {{1}, false},
      {{1, 2, 3, 255}, false},
      {{1, 2, 3, 1}, true},
  };
  for (const auto &test : kTests) {
    bssl::UniquePtr<SSL_ECH_KEYS> keys(SSL_ECH_KEYS_new());
    ASSERT_TRUE(keys);
    for (const uint8_t id : test.ids) {
      bssl::ScopedEVP_HPKE_KEY key;
      ASSERT_TRUE(
          EVP_HPKE_KEY_generate(key.get(), EVP_hpke_x25519_hkdf_sha256()));
      uint8_t *ech_config;
      size_t ech_config_len;
      ASSERT_TRUE(SSL_marshal_ech_config(&ech_config, &ech_config_len, id,
                                         key.get(), "public.example", 16));
      bssl::UniquePtr<uint8_t> free_ech_config(ech_config);
      ASSERT_TRUE(SSL_ECH_KEYS_add(keys.get(), /*is_retry_config=*/1,
                                   ech_config, ech_config_len, key.get()));
    }

    EXPECT_EQ(test.has_duplicate ? 1 : 0,
              SSL_ECH_KEYS_has_duplicate_config_id(keys.get()));
  }
}